

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vec.h
# Opt level: O0

vec<3U,_double> * __thiscall
crnlib::vec<3U,_double>::set(vec<3U,_double> *this,double val0,double val1,double val2)

{
  uint local_2c;
  uint i;
  double val2_local;
  double val1_local;
  double val0_local;
  vec<3U,_double> *this_local;
  
  this->m_s[0] = val0;
  this->m_s[1] = val1;
  this->m_s[2] = val2;
  for (local_2c = 3; local_2c < 3; local_2c = local_2c + 1) {
    this->m_s[local_2c] = 0.0;
  }
  return this;
}

Assistant:

inline vec& set(T val0, T val1, T val2)
        {
            m_s[0] = val0;
            if (N >= 2)
            {
                m_s[1] = val1;

                if (N >= 3)
                {
                    m_s[2] = val2;

                    for (uint i = 3; i < N; i++)
                    {
                        m_s[i] = 0;
                    }
                }
            }
            return *this;
        }